

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O0

unsigned_long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)

{
  unsigned_long local_20;
  unsigned_long length;
  IXML_Node *tempNode;
  IXML_NamedNodeMap *nnMap_local;
  
  local_20 = 0;
  if (nnMap != (IXML_NamedNodeMap *)0x0) {
    length = (unsigned_long)nnMap->nodeItem;
    local_20 = 0;
    for (; length != 0; length = *(unsigned_long *)(length + 0x50)) {
      local_20 = local_20 + 1;
    }
  }
  return local_20;
}

Assistant:

unsigned long ixmlNamedNodeMap_getLength(IXML_NamedNodeMap *nnMap)
{
	IXML_Node *tempNode;
	unsigned long length = 0lu;

	if (nnMap != NULL) {
		tempNode = nnMap->nodeItem;
		for (length = 0lu; tempNode != NULL; ++length) {
			tempNode = tempNode->nextSibling;
		}
	}

	return length;
}